

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
* __thiscall
bhf::ads::SymbolEntry::Parse_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
           *__return_storage_ptr__,SymbolEntry *this,uint8_t *data,size_t lengthLimit)

{
  ostream *poVar1;
  AdsException *pAVar2;
  ulong uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  stringstream stream;
  string local_258;
  undefined1 local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long *local_1b8 [2];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  if (data < (uint8_t *)0x1e) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): Read data to short to contain symbol info: ",0x2f);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    local_238[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_238,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar2,0x706);
    __cxa_throw(pAVar2,&AdsException::typeinfo,AdsException::~AdsException);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  puVar4 = (uint8_t *)(ulong)(this->header).entryLength;
  local_238._0_8_ = *(undefined8 *)&this->header;
  local_238._8_4_ = (this->header).iOffs;
  local_238._12_4_ = (this->header).size;
  local_238._16_4_ = (this->header).dataType;
  local_238._20_4_ = (this->header).flags;
  local_238._24_2_ = (this->header).nameLength;
  local_238._26_2_ = (this->header).typeLength;
  local_238._28_2_ = (this->header).commentLength;
  local_1d8._M_p = (pointer)&local_1c8;
  if (data < puVar4) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): Corrupt entry length: ",0x1a);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    local_258._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
        &local_258.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar2,0x706);
  }
  else if (puVar4 + -0x1f < (uint8_t *)(ulong)(ushort)local_238._24_2_) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): Corrupt nameLength: ",0x18);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    local_258._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
        &local_258.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar2,0x706);
  }
  else {
    puVar6 = &this->field_0x1e;
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,puVar6,(uint8_t *)(ulong)(ushort)local_238._24_2_ + (long)puVar6)
    ;
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    uVar5 = ~(ulong)(ushort)local_238._24_2_;
    if (puVar4 + (uVar5 - 0x1f) < (uint8_t *)(ulong)(ushort)local_238._26_2_) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"(): Corrupt typeLength: ",0x18);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      local_258._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,1);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
          &local_258.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_))
        ;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(pAVar2,0x706);
    }
    else {
      puVar6 = puVar6 + (ulong)(ushort)local_238._24_2_ + 1;
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,puVar6,
                 (uint8_t *)(ulong)(ushort)local_238._26_2_ + (long)puVar6);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
      uVar3 = (ulong)(ushort)local_238._26_2_;
      if ((uint8_t *)(ulong)(ushort)local_238._28_2_ <= puVar4 + (uVar5 - uVar3) + -0x20) {
        local_1b8[0] = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,puVar6 + uVar3 + 1,
                   puVar6 + (long)((uint8_t *)(ulong)(ushort)local_238._28_2_ + uVar3 + 1));
        std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b8);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0]);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::ads::SymbolEntry_&,_true>
                  (__return_storage_ptr__,&local_218,(SymbolEntry *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_p != &local_1c8) {
          operator_delete(local_1d8._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_p != &local_1e8) {
          operator_delete(local_1f8._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        return __return_storage_ptr__;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"(): Corrupt commentLength: ",0x1b);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      local_258._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,1);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
          &local_258.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_))
        ;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(pAVar2,0x706);
    }
  }
  __cxa_throw(pAVar2,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

std::pair<std::string, SymbolEntry> SymbolEntry::Parse(const uint8_t* data, size_t lengthLimit)
{
    const auto pHeader = reinterpret_cast<const AdsSymbolEntry*>(data);
    if (sizeof(*pHeader) > lengthLimit) {
        LOG_ERROR(__FUNCTION__ << "(): Read data to short to contain symbol info: " << std::dec << lengthLimit << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    SymbolEntry entry;
    entry.header.entryLength = letoh(pHeader->entryLength);
    entry.header.iGroup = letoh(pHeader->iGroup);
    entry.header.iOffs = letoh(pHeader->iOffs);
    entry.header.size = letoh(pHeader->size);
    entry.header.dataType = letoh(pHeader->dataType);
    entry.header.flags = letoh(pHeader->flags);
    entry.header.nameLength = letoh(pHeader->nameLength);
    entry.header.typeLength = letoh(pHeader->typeLength);
    entry.header.commentLength = letoh(pHeader->commentLength);

    if (entry.header.entryLength > lengthLimit) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt entry length: " << std::dec << entry.header.entryLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    lengthLimit = entry.header.entryLength - sizeof(entry.header);
    data += sizeof(entry.header);

    if (entry.header.nameLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt nameLength: " << std::dec << entry.header.nameLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.name = std::string(reinterpret_cast<const char*>(data), entry.header.nameLength);
    lengthLimit -= entry.header.nameLength + 1;
    data += entry.header.nameLength + 1;

    if (entry.header.typeLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt typeLength: " << std::dec << entry.header.typeLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.typeName = std::string(reinterpret_cast<const char*>(data), entry.header.typeLength);
    lengthLimit -= entry.header.typeLength + 1;
    data += entry.header.typeLength + 1;

    if (entry.header.commentLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt commentLength: " << std::dec << entry.header.commentLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.comment = std::string(reinterpret_cast<const char*>(data), entry.header.commentLength);
    return {entry.name, entry};
}